

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O2

void FT_Vector_Unit(FT_Vector *vec,FT_Angle angle)

{
  long lVar1;
  long lVar2;
  
  if (vec != (FT_Vector *)0x0) {
    vec->x = 0xdbd95b;
    vec->y = 0;
    ft_trig_pseudo_rotate(vec,angle);
    lVar1 = vec->x + 0x80;
    lVar2 = vec->y + 0x80;
    vec->x = CONCAT44((int)(lVar1 >> 0x28),(int)((ulong)lVar1 >> 8));
    *(int *)&vec[1].x = (int)((ulong)lVar2 >> 8);
    *(int *)((long)&vec[1].x + 4) = (int)(lVar2 >> 0x28);
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Unit( FT_Vector*  vec,
                  FT_Angle    angle )
  {
    if ( !vec )
      return;

    vec->x = FT_TRIG_SCALE >> 8;
    vec->y = 0;
    ft_trig_pseudo_rotate( vec, angle );
    vec->x = ( vec->x + 0x80L ) >> 8;
    vec->y = ( vec->y + 0x80L ) >> 8;
  }